

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall anon_unknown.dwarf_1130a34::InfoWriter::Save(InfoWriter *this,string *filename)

{
  byte bVar1;
  size_t __n;
  allocator<char> local_329;
  String local_328;
  undefined1 local_308 [8];
  StyledStreamWriter jsonWriter;
  undefined1 local_288 [8];
  cmGeneratedFileStream fileStream;
  string *filename_local;
  InfoWriter *this_local;
  
  fileStream._608_8_ = filename;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_288,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_288,true);
  __n = 1;
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_288,(string *)fileStream._608_8_,false,true);
  bVar1 = std::ios::operator!((ios *)(local_288 + (long)*(_func_int **)((long)local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"\t",&local_329);
    Json::StyledStreamWriter::StyledStreamWriter((StyledStreamWriter *)local_308,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    Json::StyledStreamWriter::write((StyledStreamWriter *)local_308,(int)local_288,this,__n);
    this_local._7_1_ = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_288);
    jsonWriter._104_4_ = 1;
    Json::StyledStreamWriter::~StyledStreamWriter((StyledStreamWriter *)local_308);
  }
  else {
    this_local._7_1_ = false;
    jsonWriter._104_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  return this_local._7_1_;
}

Assistant:

bool InfoWriter::Save(std::string const& filename)
{
  cmGeneratedFileStream fileStream;
  fileStream.SetCopyIfDifferent(true);
  fileStream.Open(filename, false, true);
  if (!fileStream) {
    return false;
  }

  Json::StyledStreamWriter jsonWriter;
  try {
    jsonWriter.write(fileStream, this->Value_);
  } catch (...) {
    return false;
  }

  return fileStream.Close();
}